

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

char * read_opts(int argc,char **argv)

{
  uint32_t uVar1;
  byte *pbVar2;
  int iVar3;
  char *__path;
  char *__s1;
  ulong uVar4;
  gpu_object_decoder *pgVar5;
  char *local_40;
  
  if ((argc < 2) && (iVar3 = isatty(0), iVar3 != 0)) {
switchD_00245ab3_caseD_68:
    usage();
LAB_00245e10:
    read_opts_cold_2();
LAB_00245e15:
    read_opts_cold_4();
LAB_00245e1a:
    read_opts_cold_7();
LAB_00245e1f:
    read_opts_cold_5();
LAB_00245e24:
    read_opts_cold_8();
LAB_00245e29:
    read_opts_cold_3();
LAB_00245e2e:
    read_opts_cold_6();
  }
  pager_enabled = isatty(1);
  colors = &envy_def_colors;
  if (pager_enabled == 0) {
    colors = &envy_null_colors;
  }
  local_40 = (char *)0x0;
switchD_00245ab3_caseD_62:
  iVar3 = getopt(argc,argv,"m:o:g:qac:l:i:r:he:d:p:s:x:");
  pbVar2 = _optarg;
  switch(iVar3) {
  case 0x61:
    uVar1 = obj_decoders[0].class_;
    pgVar5 = obj_decoders;
    while (pgVar5 = pgVar5 + 1, uVar1 != 0) {
      pgVar5[-1].disabled = 1;
      uVar1 = pgVar5->class_;
    }
  case 0x62:
  case 0x66:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_00245ab3_caseD_62;
  case 99:
    if (*_optarg == 0x30) {
      colors = &envy_null_colors;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e2e;
      colors = &envy_def_colors;
    }
    goto switchD_00245ab3_caseD_62;
  case 100:
    handle_filter_opt((char *)_optarg,0);
    goto switchD_00245ab3_caseD_62;
  case 0x65:
    handle_filter_opt((char *)_optarg,1);
    goto switchD_00245ab3_caseD_62;
  case 0x67:
    if (*_optarg == 0x30) {
      print_gpu_addresses = 0;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e1a;
      print_gpu_addresses = 1;
    }
    goto switchD_00245ab3_caseD_62;
  case 0x68:
    goto switchD_00245ab3_caseD_68;
  case 0x69:
    if (*_optarg == 0x30) {
      indent_logs = 0;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e1f;
      indent_logs = 1;
    }
    goto switchD_00245ab3_caseD_62;
  case 0x6c:
    local_40 = strdup((char *)_optarg);
    __path = strdup(local_40);
    __s1 = __xpg_basename(__path);
    if ((chipset == 0) && (iVar3 = strncasecmp(__s1,"nv",2), iVar3 == 0)) {
      uVar4 = strtoul(__s1 + 2,(char **)0x0,0x10);
      chipset = (int)uVar4;
    }
    free(__path);
    goto switchD_00245ab3_caseD_62;
  case 0x6d:
    iVar3 = strncasecmp((char *)_optarg,"NV",2);
    uVar4 = strtoul((char *)(pbVar2 + (ulong)(iVar3 == 0) * 2),(char **)0x0,0x10);
    chipset = (int)uVar4;
    goto switchD_00245ab3_caseD_62;
  case 0x6f:
    if (*_optarg == 0x30) {
      dump_raw_ioctl_data = 0;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e24;
      dump_raw_ioctl_data = 1;
    }
    goto switchD_00245ab3_caseD_62;
  case 0x70:
    if (*_optarg == 0x30) {
      pager_enabled = 0;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e29;
      pager_enabled = 1;
    }
    goto switchD_00245ab3_caseD_62;
  case 0x71:
    handle_filter_opt("all",0);
    decode_pb = 1;
    dump_tsc = 1;
    dump_tic = 1;
    dump_cp = 1;
    handle_filter_opt("shader",1);
    handle_filter_opt("macro",1);
    dump_buffer_usage = 1;
    if (obj_decoders[0].class_ != 0) {
      pgVar5 = obj_decoders;
      do {
        pgVar5 = pgVar5 + 1;
        pgVar5[-1].disabled = 0;
      } while (pgVar5->class_ != 0);
    }
    nvrm_describe_classes = 1;
    goto switchD_00245ab3_caseD_62;
  case 0x72:
    if (*_optarg == 0x30) {
      macro_rt_verbose = 0;
    }
    else {
      if (*_optarg != 0x31) goto LAB_00245e15;
      macro_rt_verbose = 1;
    }
    goto switchD_00245ab3_caseD_62;
  case 0x73:
    mmt_sync_fd = open((char *)_optarg,1);
    goto switchD_00245ab3_caseD_62;
  case 0x78:
    if (*_optarg != 0x30) {
      if (1 < *_optarg - 0x31) goto LAB_00245e10;
      read_opts_cold_1();
      goto switchD_00245ab3_caseD_68;
    }
    seccomp_level = 0;
    goto switchD_00245ab3_caseD_62;
  default:
    if (iVar3 == -1) {
      return local_40;
    }
    if (iVar3 != 0x3f) goto switchD_00245ab3_caseD_62;
    goto switchD_00245ab3_caseD_68;
  }
}

Assistant:

char *read_opts(int argc, char *argv[])
{
	char *filename = NULL;

	if (argc < 2 && isatty(0))
		usage();

	pager_enabled = isatty(1);
	if (pager_enabled)
		colors = &envy_def_colors;
	else
		colors = &envy_null_colors;

	int c;
	while ((c = getopt (argc, argv, "m:o:g:qac:l:i:r:he:d:p:s:x:")) != -1)
	{
		switch (c)
		{
			case 'm':
			{
				char *chip = optarg;
				if (strncasecmp(chip, "NV", 2) == 0)
					chip += 2;
				chipset = strtoul(chip, NULL, 16);
				break;
			}
			case 'o':
				if (optarg[0] == '1')
					_filter_ioctl_raw(1);
				else if (optarg[0] == '0')
					_filter_ioctl_raw(0);
				else
				{
					fprintf(stderr, "-o accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'g':
				if (optarg[0] == '1')
					_filter_gpu_addr(1);
				else if (optarg[0] == '0')
					_filter_gpu_addr(0);
				else
				{
					fprintf(stderr, "-g accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'q':
				handle_filter_opt("all", 0);
				_filter_decode_pb(1);
				_filter_tsc(1);
				_filter_tic(1);
				_filter_cp(1);
				handle_filter_opt("shader", 1);
				handle_filter_opt("macro", 1);
				_filter_buffer_usage(1);
				_filter_all_classes(1);
				_filter_nvrm_describe_classes(1);
				break;
			case 'a':
				_filter_all_classes(0);
				break;
			case 'c':
				if (optarg[0] == '1')
					colors = &envy_def_colors;
				else if (optarg[0] == '0')
					colors = &envy_null_colors;
				else
				{
					fprintf(stderr, "-c accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'l':
			{
				filename = strdup(optarg);
				char *maybe_chipset = strdup(filename);
				const char *base = basename(maybe_chipset);
				if (chipset == 0 && strncasecmp(base, "nv", 2) == 0)
					chipset = strtoul(base + 2, NULL, 16);
				free(maybe_chipset);
				break;
			}
			case 'i':
				if (optarg[0] == '1')
					indent_logs = 1;
				else if (optarg[0] == '0')
					indent_logs = 0;
				else
				{
					fprintf(stderr, "-i accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'r':
				if (optarg[0] == '1')
					_filter_macro_rt_verbose(1);
				else if (optarg[0] == '0')
					_filter_macro_rt_verbose(0);
				else
				{
					fprintf(stderr, "-r accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'p':
				if (optarg[0] == '1')
					_filter_pager_enabled(1);
				else if (optarg[0] == '0')
					_filter_pager_enabled(0);
				else
				{
					fprintf(stderr, "-p accepts only 0 and 1\n");
					exit(1);
				}
				break;
			case 'x':
				if (optarg[0] == '1' || optarg[0] == '2')
				{
#ifdef LIBSECCOMP_AVAILABLE
					_filter_seccomp(optarg[0] - '1' + 1);
#else
					fprintf(stderr, "demmt needs libseccomp to enable sandboxing\n");
					exit(1);
#endif
				}
				else if (optarg[0] == '0')
					_filter_seccomp(0);
				else
				{
					fprintf(stderr, "-x accepts only 0, 1 and 2\n");
					exit(1);
				}
				break;
			case 'h':
			case '?':
				usage();
				break;
			case 'd':
				handle_filter_opt(optarg, 0);
				break;
			case 'e':
				handle_filter_opt(optarg, 1);
				break;
			case 's':
				mmt_sync_fd = open(optarg, O_WRONLY);
				break;
		}
	}

	return filename;
}